

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void PANIC(char *functionname,char *filename,unsigned_long_long linenum)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s%s%s%s in %s%s%s at line %s%s%lld %s%sfailed.%s\n","\x1b[1m","\x1b[95m",in_RDI,
          "\x1b[91m","\x1b[93m");
  exit(-1);
}

Assistant:

__attribute__((__noreturn__))
#endif /* _WIN32 */
void
PANIC(const char *functionname,
      const char *filename,
      const unsigned long long linenum)
{
  do
  {
    fprintf(stderr,
            "%s%s%s%s in %s%s%s at line %s%s%lld %s%sfailed.%s\n",
            colors.styles.bold,
            colors.strong_fg.magenta,
            functionname,
            colors.strong_fg.red,
            colors.strong_fg.yellow,
            filename,
            colors.strong_fg.red,
            colors.styles.reset,
            colors.normal_fg.blue,
            linenum,
            colors.strong_fg.red,
            colors.styles.bold,
            colors.styles.reset);
    exit(-1);
  } while (1); /* Keep the compiler happy. */
}